

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_Choice.H
# Opt level: O0

void __thiscall Fl_Input_Choice::InputMenuButton::draw(InputMenuButton *this)

{
  Fl_Color FVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fl_Widget *pFVar5;
  undefined4 local_24;
  int yc;
  int xc;
  InputMenuButton *this_local;
  
  FVar1 = Fl_Widget::color((Fl_Widget *)this);
  Fl_Widget::draw_box((Fl_Widget *)this,FL_UP_BOX,FVar1);
  iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
  if (iVar2 == 0) {
    FVar1 = Fl_Widget::labelcolor((Fl_Widget *)this);
    local_24 = fl_inactive(FVar1);
  }
  else {
    local_24 = Fl_Widget::labelcolor((Fl_Widget *)this);
  }
  fl_color(local_24);
  iVar3 = Fl_Widget::x((Fl_Widget *)this);
  iVar2 = Fl_Widget::w((Fl_Widget *)this);
  iVar3 = iVar3 + iVar2 / 2;
  iVar4 = Fl_Widget::y((Fl_Widget *)this);
  iVar2 = Fl_Widget::h((Fl_Widget *)this);
  iVar4 = iVar4 + iVar2 / 2;
  fl_polygon(iVar3 + -5,iVar4 + -3,iVar3 + 5,iVar4 + -3,iVar3,iVar4 + 3);
  pFVar5 = Fl::focus();
  if (pFVar5 == (Fl_Widget *)this) {
    Fl_Widget::draw_focus((Fl_Widget *)this);
  }
  return;
}

Assistant:

void draw() {
      draw_box(FL_UP_BOX, color());
      fl_color(active_r() ? labelcolor() : fl_inactive(labelcolor()));
      int xc = x()+w()/2, yc=y()+h()/2;
      fl_polygon(xc-5,yc-3,xc+5,yc-3,xc,yc+3);
      if (Fl::focus() == this) draw_focus();
    }